

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftraster.c
# Opt level: O3

Bool Bezier_Down(black_PWorker worker,Int degree,TPoint *arc,TSplitter splitter,Long miny,Long maxy)

{
  Long *pLVar1;
  char cVar2;
  Bool BVar3;
  
  arc->y = -arc->y;
  arc[1].y = -arc[1].y;
  arc[2].y = -arc[2].y;
  if (2 < degree) {
    arc[3].y = -arc[3].y;
  }
  cVar2 = worker->fresh;
  BVar3 = Bezier_Up(worker,degree,arc,splitter,-maxy,-miny);
  if ((cVar2 != '\0') && (worker->fresh == '\0')) {
    pLVar1 = &worker->cProfile->start;
    *pLVar1 = -*pLVar1;
  }
  arc->y = -arc->y;
  return BVar3;
}

Assistant:

static Bool
  Bezier_Down( RAS_ARGS Int        degree,
                        TPoint*    arc,
                        TSplitter  splitter,
                        Long       miny,
                        Long       maxy )
  {
    Bool     result, fresh;


    arc[0].y = -arc[0].y;
    arc[1].y = -arc[1].y;
    arc[2].y = -arc[2].y;
    if ( degree > 2 )
      arc[3].y = -arc[3].y;

    fresh = ras.fresh;

    result = Bezier_Up( RAS_VARS degree, arc, splitter, -maxy, -miny );

    if ( fresh && !ras.fresh )
      ras.cProfile->start = -ras.cProfile->start;

    arc[0].y = -arc[0].y;
    return result;
  }